

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  ~DataSegmentModuleField(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}